

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O3

void __thiscall ON_UserData::Dump(ON_UserData *this,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  wchar_t *pwVar3;
  char *pcVar4;
  ON_wString description;
  ON_wString local_20;
  
  ON_TextLog::Print(text_log,"User Data:\n");
  ON_TextLog::PushIndent(text_log);
  ON_Object::Dump(&this->super_ON_Object,text_log);
  ON_wString::ON_wString(&local_20);
  (*(this->super_ON_Object)._vptr_ON_Object[0x18])(this,&local_20);
  bVar1 = ON_wString::IsEmpty(&local_20);
  if (bVar1) {
    ON_wString::operator=(&local_20,L"none");
  }
  pwVar3 = ON_wString::operator_cast_to_wchar_t_(&local_20);
  ON_TextLog::Print(text_log,"user data description: %ls\n",pwVar3);
  ON_TextLog::Print(text_log,"user data uuid: ");
  ON_TextLog::Print(text_log,&this->m_userdata_uuid);
  ON_TextLog::Print(text_log,"\n");
  ON_TextLog::Print(text_log,"user data copy count: %d\n",(ulong)this->m_userdata_copycount);
  iVar2 = (*(this->super_ON_Object)._vptr_ON_Object[0x19])(this);
  pcVar4 = "no";
  if ((char)iVar2 != '\0') {
    pcVar4 = "yes";
  }
  ON_TextLog::Print(text_log,"user data saved in 3dm archive: %s\n",pcVar4);
  ON_TextLog::PopIndent(text_log);
  ON_wString::~ON_wString(&local_20);
  return;
}

Assistant:

void ON_UserData::Dump( ON_TextLog& text_log ) const
{
  text_log.Print("User Data:\n");
  text_log.PushIndent();

  // print class name and class uuid
  ON_Object::Dump(text_log);

  // developer's user data description
  ON_wString description;
  const_cast<ON_UserData*>(this)->GetDescription(description);
  if ( description.IsEmpty() )
    description = L"none";
  const wchar_t* ws = static_cast< const wchar_t* >(description);
  text_log.Print("user data description: %ls\n",ws);
  text_log.Print("user data uuid: ");
  text_log.Print(m_userdata_uuid);
  text_log.Print("\n");
  text_log.Print("user data copy count: %d\n",this->m_userdata_copycount);

  // archive setting
  text_log.Print("user data saved in 3dm archive: %s\n",Archive() ? "yes" : "no");

  text_log.PopIndent();
}